

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallNormalHeapBucket.cpp
# Opt level: O2

void __thiscall
Memory::SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_>::
Verify(SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_>
       *this)

{
  code *pcVar1;
  bool bVar2;
  Recycler *pRVar3;
  undefined4 *puVar4;
  
  HeapBucketT<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_>::Verify
            (&this->
              super_HeapBucketT<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_>);
  if (this->partialHeapBlockList != (SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
    pRVar3 = HeapBucket::GetRecycler((HeapBucket *)this);
    if (pRVar3->inPartialCollectMode == false) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                         ,0x2f2,
                         "(this->partialHeapBlockList == nullptr || this->GetRecycler()->inPartialCollectMode)"
                         ,
                         "this->partialHeapBlockList == nullptr || this->GetRecycler()->inPartialCollectMode"
                        );
      if (!bVar2) goto LAB_006b0e23;
      *puVar4 = 0;
    }
  }
  HeapBlockList::
  ForEach<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>,Memory::SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>>::Verify()::_lambda(Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>*)_1_>
            (this->partialHeapBlockList);
  if (this->partialSweptHeapBlockList !=
      (SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
    pRVar3 = HeapBucket::GetRecycler((HeapBucket *)this);
    if (pRVar3->inPartialCollectMode == false) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                         ,0x2f9,
                         "(this->partialSweptHeapBlockList == nullptr || this->GetRecycler()->inPartialCollectMode)"
                         ,
                         "this->partialSweptHeapBlockList == nullptr || this->GetRecycler()->inPartialCollectMode"
                        );
      if (!bVar2) {
LAB_006b0e23:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
  }
  HeapBlockList::
  ForEach<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>,Memory::SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>>::Verify()::_lambda(Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>*)_2_>
            (this->partialSweptHeapBlockList);
  return;
}

Assistant:

void
SmallNormalHeapBucketBase<TBlockType>::Verify()
{
    __super::Verify();
    Assert(this->partialHeapBlockList == nullptr || this->GetRecycler()->inPartialCollectMode);
    HeapBlockList::ForEach(this->partialHeapBlockList, [](TBlockType * heapBlock)
    {
        Assert(heapBlock->HasFreeObject());
        heapBlock->Verify();
    });
#if ENABLE_CONCURRENT_GC
    Assert(this->partialSweptHeapBlockList == nullptr || this->GetRecycler()->inPartialCollectMode);
    HeapBlockList::ForEach(this->partialSweptHeapBlockList, [](TBlockType * heapBlock)
    {
        heapBlock->Verify();
    });
#endif
}